

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::TPZSkylMatrix
          (TPZSkylMatrix<std::complex<long_double>_> *this,int64_t dim,TPZVec<long> *skyline)

{
  int64_t in_RDX;
  int64_t in_RSI;
  TPZVec<std::complex<long_double>_*> *in_RDI;
  TPZVec<std::complex<long_double>_*> *unaff_retaddr;
  int64_t in_stack_00000008;
  TPZVec<std::complex<long_double>_> *in_stack_00000010;
  TPZVec<std::complex<long_double>_*> *in_stack_00000020;
  TPZVec<std::complex<long_double>_> *in_stack_00000028;
  TPZVec<long> *in_stack_00000030;
  int64_t in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb8;
  int64_t in_stack_ffffffffffffffc0;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffd0;
  TPZVec<std::complex<long_double>_*> *copy;
  
  copy = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZSkylMatrix<std::complex<long_double>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZMatrix<std::complex<long_double>_>::TPZMatrix
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZSkylMatrix_02414eb0;
  TPZVec<std::complex<long_double>_*>::TPZVec(in_RDI,in_stack_ffffffffffffffa8);
  TPZVec<std::complex<long_double>_>::TPZVec(in_stack_00000010,in_stack_00000008);
  TPZVec<std::complex<long_double>_*>::Fill
            (unaff_retaddr,(complex<long_double> **)copy,in_RSI,in_RDX);
  InitializeElem(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  return;
}

Assistant:

TPZSkylMatrix<TVar>::TPZSkylMatrix(const int64_t dim, const TPZVec<int64_t> &skyline )
: TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>( dim, dim ), fElem(dim+1), fStorage(0)
{
	
	// Inicializa a diagonal (vazia).
	fElem.Fill(0);
	InitializeElem(skyline,fStorage,fElem);
}